

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void luaL_checktype(lua_State *L,int narg,int t)

{
  int iVar1;
  TValue *pTVar2;
  char *tname;
  
  pTVar2 = index2adr(L,narg);
  if (pTVar2 == &luaO_nilobject_) {
    iVar1 = -1;
  }
  else {
    iVar1 = pTVar2->tt;
  }
  if (iVar1 == t) {
    return;
  }
  if (t == -1) {
    tname = "no value";
  }
  else {
    tname = luaT_typenames[t];
  }
  luaL_typerror(L,narg,tname);
}

Assistant:

static void luaL_checktype(lua_State*L,int narg,int t){
if(lua_type(L,narg)!=t)
tag_error(L,narg,t);
}